

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O1

uint32_t bitset_container_rank_many
                   (bitset_container_t *container,uint64_t start_rank,uint32_t *begin,uint32_t *end,
                   uint64_t *ans)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  ulong in_R9;
  uint32_t *puVar8;
  ulong local_60;
  
  puVar8 = begin;
  if (begin != end) {
    uVar1 = *begin;
    uVar4 = 0;
    iVar6 = 0;
    local_60 = in_R9;
    do {
      uVar2 = *puVar8;
      if ((uVar2 ^ uVar1) < 0x10000) {
        uVar7 = uVar2 >> 6 & 0x3ff;
        if ((int)uVar4 < (int)uVar7) {
          lVar3 = 0;
          do {
            uVar5 = container->words[(int)uVar4 + lVar3] -
                    (container->words[(int)uVar4 + lVar3] >> 1 & 0x5555555555555555);
            uVar5 = (uVar5 >> 2 & 0x3333333333333333) + (uVar5 & 0x3333333333333333);
            iVar6 = iVar6 + (uint)(byte)(((uVar5 >> 4) + uVar5 & 0xf0f0f0f0f0f0f0f) *
                                         0x101010101010101 >> 0x38);
            lVar3 = lVar3 + 1;
          } while ((ulong)uVar7 - (long)(int)uVar4 != lVar3);
          uVar4 = uVar4 + (int)lVar3;
        }
        uVar5 = (2L << ((byte)uVar2 & 0x3f)) - 1U & container->words[uVar4];
        uVar5 = uVar5 - (uVar5 >> 1 & 0x5555555555555555);
        uVar5 = (uVar5 >> 2 & 0x3333333333333333) + (uVar5 & 0x3333333333333333);
        *ans = (((uVar5 >> 4) + uVar5 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38) +
               (long)iVar6 + start_rank;
        ans = ans + 1;
      }
      else {
        local_60 = (ulong)((long)puVar8 - (long)begin) >> 2;
      }
      if (0xffff < (uVar2 ^ uVar1)) {
        return (uint32_t)local_60;
      }
      puVar8 = puVar8 + 1;
    } while (puVar8 != end);
  }
  return (uint32_t)((ulong)((long)puVar8 - (long)begin) >> 2);
}

Assistant:

uint32_t bitset_container_rank_many(const bitset_container_t *container, uint64_t start_rank, const uint32_t* begin, const uint32_t* end, uint64_t* ans){
  const uint16_t high = (uint16_t)((*begin) >> 16);
  int i = 0;
  int sum = 0;
  const uint32_t* iter = begin;
  for(; iter != end; iter++) {
      uint32_t x = *iter;
      uint16_t xhigh = (uint16_t)(x >> 16);
      if(xhigh != high) return iter - begin; // stop at next container

      uint16_t xlow = (uint16_t)x;
      for(int count = xlow / 64; i < count; i++){
        sum += roaring_hamming(container->words[i]);
      }
      uint64_t lastword = container->words[i];
      uint64_t lastpos = UINT64_C(1) << (xlow % 64);
      uint64_t mask = lastpos + lastpos - 1; // smear right
      *(ans++) = start_rank + sum + roaring_hamming(lastword & mask);
  }
  return iter - begin;
}